

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.h
# Opt level: O2

void __thiscall CTcTokString::ensure_space(CTcTokString *this,size_t siz)

{
  char *pcVar1;
  size_t __size;
  
  if (this->buf_size_ < siz + 1) {
    __size = (siz & 0xfffffffffffff000) + 0x1000;
    this->buf_size_ = __size;
    if (this->buf_ == (char *)0x0) {
      pcVar1 = (char *)malloc(__size);
    }
    else {
      pcVar1 = (char *)realloc(this->buf_,__size);
    }
    this->buf_ = pcVar1;
    if (pcVar1 == (char *)0x0) {
      err_throw(0x2736);
    }
  }
  return;
}

Assistant:

virtual void ensure_space(size_t siz)
    {
        /* make sure there's room for the requested size plus a null byte */
        if (buf_size_ < siz + 1)
        {
            /* increase to the next 4k increment */
            buf_size_ = (siz + 4095 + 1) & ~4095;
            
            /* allocate or re-allocate the buffer */
            if (buf_ == 0)
                buf_ = (char *)t3malloc(buf_size_);
            else
                buf_ = (char *)t3realloc(buf_, buf_size_);

            /* throw an error if that failed */
            if (buf_ == 0)
                err_throw(TCERR_NO_STRBUF_MEM);
        }
    }